

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.c
# Opt level: O0

_Bool read_RGB_paletted_image
                (ALLEGRO_FILE *f,int flags,BMPINFOHEADER *infoheader,PalEntry *pal,
                ALLEGRO_LOCKED_REGION *lr,bmp_line_fn fn)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long in_RCX;
  undefined8 *in_RDX;
  undefined8 in_RDI;
  long *in_R8;
  code *in_R9;
  uchar idx;
  char *data;
  char *linebuf;
  size_t linesize;
  int dir;
  int width;
  int height;
  int line;
  int j;
  int i;
  int local_70;
  long local_58;
  int local_44;
  int local_40;
  int local_3c;
  _Bool local_1;
  
  iVar2 = (int)in_RDX[1];
  iVar3 = (int)*in_RDX;
  if (*(ushort *)(in_RDX + 2) < 8) {
    uVar4 = (uint)(8 / (ulong)(long)(int)(uint)*(ushort *)(in_RDX + 2));
  }
  else {
    uVar4 = *(ushort *)(in_RDX + 2) / 8;
  }
  local_58 = (long)(int)uVar4 * (long)(int)(iVar3 + 3U & 0xfffffffc);
  lVar6 = al_malloc_with_context
                    (local_58,0x2e0,
                     "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/image/bmp.c"
                     ,"read_RGB_paletted_image");
  if (lVar6 == 0) {
    uVar7 = _al_trace_prefix(__al_debug_channel,2,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/image/bmp.c"
                             ,0x2e3,"read_RGB_paletted_image");
    if ((uVar7 & 1) != 0) {
      _al_trace_suffix("Failed to allocate pixel row buffer\n");
    }
    local_1 = false;
  }
  else {
    if (iVar2 < 0) {
      local_70 = 0;
    }
    else {
      local_70 = iVar2 + -1;
    }
    local_44 = local_70;
    iVar5 = -1;
    if (iVar2 < 0) {
      iVar5 = 1;
    }
    if (iVar2 < 1) {
      iVar2 = -iVar2;
    }
    for (local_3c = 0; local_3c < iVar2; local_3c = local_3c + 1) {
      lVar8 = *in_R8 + (long)(*(int *)((long)in_R8 + 0xc) * local_44);
      (*in_R9)(in_RDI,lVar6,lVar8,iVar3,0);
      for (local_40 = 0; local_40 < iVar3; local_40 = local_40 + 1) {
        bVar1 = *(byte *)(lVar6 + local_40);
        *(char *)(lVar8 + (local_40 << 2)) = (char)*(undefined4 *)(in_RCX + (ulong)bVar1 * 0x10);
        *(char *)(lVar8 + (local_40 * 4 + 1)) =
             (char)*(undefined4 *)(in_RCX + (ulong)bVar1 * 0x10 + 4);
        *(char *)(lVar8 + (local_40 * 4 + 2)) =
             (char)*(undefined4 *)(in_RCX + (ulong)bVar1 * 0x10 + 8);
        *(char *)(lVar8 + (local_40 * 4 + 3)) =
             (char)*(undefined4 *)(in_RCX + (ulong)bVar1 * 0x10 + 0xc);
      }
      local_44 = iVar5 + local_44;
    }
    al_free_with_context
              (lVar6,0x2f8,
               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/image/bmp.c"
               ,"read_RGB_paletted_image");
    local_1 = true;
  }
  return local_1;
}

Assistant:

static bool read_RGB_paletted_image(ALLEGRO_FILE *f, int flags,
   const BMPINFOHEADER *infoheader, PalEntry* pal,
   ALLEGRO_LOCKED_REGION *lr, bmp_line_fn fn)
{
   int i, j, line, height, width, dir;
   size_t linesize;
   char *linebuf;

   (void)flags;

   height = infoheader->biHeight;
   width = infoheader->biWidth;

   // Includes enough space to read the padding for a line
   linesize = (width + 3) & ~3;

   if (infoheader->biBitCount < 8)
      linesize *= (8 / infoheader->biBitCount);
   else
      linesize *= (infoheader->biBitCount / 8);

   linebuf = al_malloc(linesize);

   if (!linebuf) {
      ALLEGRO_WARN("Failed to allocate pixel row buffer\n");
      return false;
   }

   line = height < 0 ? 0 : height - 1;
   dir = height < 0 ? 1 : -1;
   height = abs(height);

   for (i = 0; i < height; i++, line += dir) {
      char *data = (char *)lr->data + lr->pitch * line;
      fn(f, linebuf, data, width, false);

      for (j = 0; j < width; ++j) {
         unsigned char idx = linebuf[j];
         data[j*4]   = pal[idx].r;
         data[j*4+1] = pal[idx].g;
         data[j*4+2] = pal[idx].b;
         data[j*4+3] = pal[idx].a;
      }
   }

   al_free(linebuf);

   return true;
}